

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O0

void stbir__resample_horizontal_upsample(stbir__info *stbir_info,float *output_buffer)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  stbir__contributors *psVar6;
  float *pfVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  float *pfVar11;
  int local_84;
  int c;
  float coefficient_4;
  int in_pixel_index_4;
  float coefficient_3;
  int in_pixel_index_3;
  float coefficient_2;
  int in_pixel_index_2;
  float coefficient_1;
  int in_pixel_index_1;
  float coefficient;
  int in_pixel_index;
  int coefficient_counter;
  int coefficient_group;
  int out_pixel_index;
  int n1;
  int n0;
  int coefficient_width;
  float *horizontal_coefficients;
  stbir__contributors *horizontal_contributors;
  float *decode_buffer;
  int channels;
  int output_w;
  int k;
  int x;
  float *output_buffer_local;
  stbir__info *stbir_info_local;
  
  iVar2 = stbir_info->output_w;
  iVar3 = stbir_info->channels;
  pfVar11 = stbir__get_decode_buffer(stbir_info);
  psVar6 = stbir_info->horizontal_contributors;
  pfVar7 = stbir_info->horizontal_coefficients;
  iVar4 = stbir_info->horizontal_coefficient_width;
  output_w = 0;
  while( true ) {
    if (iVar2 <= output_w) {
      return;
    }
    channels = psVar6[output_w].n0;
    iVar5 = psVar6[output_w].n1;
    iVar8 = output_w * iVar3;
    iVar9 = iVar4 * output_w;
    coefficient = 0.0;
    if (iVar5 < channels) {
      __assert_fail("n1 >= n0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                    ,0x5be,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
    }
    if (SBORROW4(channels,-stbir_info->horizontal_filter_pixel_margin) !=
        channels + stbir_info->horizontal_filter_pixel_margin < 0) {
      __assert_fail("n0 >= -stbir_info->horizontal_filter_pixel_margin",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                    ,0x5bf,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
    }
    if (iVar5 < -stbir_info->horizontal_filter_pixel_margin) break;
    if (stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin <= channels) {
      __assert_fail("n0 < stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                    ,0x5c1,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
    }
    if (stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin <= iVar5) {
      __assert_fail("n1 < stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                    ,0x5c2,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
    }
    switch(iVar3) {
    case 1:
      for (; channels <= iVar5; channels = channels + 1) {
        fVar1 = pfVar7[iVar9 + (int)coefficient];
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          __assert_fail("coefficient != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                        ,0x5ca,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
        }
        output_buffer[iVar8] = pfVar11[channels] * fVar1 + output_buffer[iVar8];
        coefficient = (float)((int)coefficient + 1);
      }
      break;
    case 2:
      for (; channels <= iVar5; channels = channels + 1) {
        fVar1 = pfVar7[iVar9 + (int)coefficient];
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          __assert_fail("coefficient != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                        ,0x5d3,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
        }
        output_buffer[iVar8] = pfVar11[channels * 2] * fVar1 + output_buffer[iVar8];
        output_buffer[iVar8 + 1] = pfVar11[channels * 2 + 1] * fVar1 + output_buffer[iVar8 + 1];
        coefficient = (float)((int)coefficient + 1);
      }
      break;
    case 3:
      for (; channels <= iVar5; channels = channels + 1) {
        iVar10 = channels * 3;
        fVar1 = pfVar7[iVar9 + (int)coefficient];
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          __assert_fail("coefficient != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                        ,0x5dd,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
        }
        output_buffer[iVar8] = pfVar11[iVar10] * fVar1 + output_buffer[iVar8];
        output_buffer[iVar8 + 1] = pfVar11[iVar10 + 1] * fVar1 + output_buffer[iVar8 + 1];
        output_buffer[iVar8 + 2] = pfVar11[iVar10 + 2] * fVar1 + output_buffer[iVar8 + 2];
        coefficient = (float)((int)coefficient + 1);
      }
      break;
    case 4:
      for (; channels <= iVar5; channels = channels + 1) {
        iVar10 = channels * 4;
        fVar1 = pfVar7[iVar9 + (int)coefficient];
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          __assert_fail("coefficient != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                        ,0x5e8,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
        }
        output_buffer[iVar8] = pfVar11[iVar10] * fVar1 + output_buffer[iVar8];
        output_buffer[iVar8 + 1] = pfVar11[iVar10 + 1] * fVar1 + output_buffer[iVar8 + 1];
        output_buffer[iVar8 + 2] = pfVar11[iVar10 + 2] * fVar1 + output_buffer[iVar8 + 2];
        output_buffer[iVar8 + 3] = pfVar11[iVar10 + 3] * fVar1 + output_buffer[iVar8 + 3];
        coefficient = (float)((int)coefficient + 1);
      }
      break;
    default:
      for (; channels <= iVar5; channels = channels + 1) {
        fVar1 = pfVar7[iVar9 + (int)coefficient];
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          __assert_fail("coefficient != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                        ,0x5f5,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
        }
        for (local_84 = 0; local_84 < iVar3; local_84 = local_84 + 1) {
          output_buffer[iVar8 + local_84] =
               pfVar11[channels * iVar3 + local_84] * fVar1 + output_buffer[iVar8 + local_84];
        }
        coefficient = (float)((int)coefficient + 1);
      }
    }
    output_w = output_w + 1;
  }
  __assert_fail("n1 >= -stbir_info->horizontal_filter_pixel_margin",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                ,0x5c0,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
}

Assistant:

static void stbir__resample_horizontal_upsample(stbir__info* stbir_info, float* output_buffer)
{
    int x, k;
    int output_w = stbir_info->output_w;
    int channels = stbir_info->channels;
    float* decode_buffer = stbir__get_decode_buffer(stbir_info);
    stbir__contributors* horizontal_contributors = stbir_info->horizontal_contributors;
    float* horizontal_coefficients = stbir_info->horizontal_coefficients;
    int coefficient_width = stbir_info->horizontal_coefficient_width;

    for (x = 0; x < output_w; x++)
    {
        int n0 = horizontal_contributors[x].n0;
        int n1 = horizontal_contributors[x].n1;

        int out_pixel_index = x * channels;
        int coefficient_group = coefficient_width * x;
        int coefficient_counter = 0;

        STBIR_ASSERT(n1 >= n0);
        STBIR_ASSERT(n0 >= -stbir_info->horizontal_filter_pixel_margin);
        STBIR_ASSERT(n1 >= -stbir_info->horizontal_filter_pixel_margin);
        STBIR_ASSERT(n0 < stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin);
        STBIR_ASSERT(n1 < stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin);

        switch (channels) {
            case 1:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * 1;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                }
                break;
            case 2:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * 2;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                }
                break;
            case 3:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * 3;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                    output_buffer[out_pixel_index + 2] += decode_buffer[in_pixel_index + 2] * coefficient;
                }
                break;
            case 4:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * 4;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                    output_buffer[out_pixel_index + 2] += decode_buffer[in_pixel_index + 2] * coefficient;
                    output_buffer[out_pixel_index + 3] += decode_buffer[in_pixel_index + 3] * coefficient;
                }
                break;
            default:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * channels;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    int c;
                    STBIR_ASSERT(coefficient != 0);
                    for (c = 0; c < channels; c++)
                        output_buffer[out_pixel_index + c] += decode_buffer[in_pixel_index + c] * coefficient;
                }
                break;
        }
    }
}